

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emoticon.cpp
# Opt level: O1

void __thiscall CEmoticon::DrawCircle(CEmoticon *this,float x,float y,float r,int Segments)

{
  IGraphics *pIVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  long in_FS_OFFSET;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  CFreeformItem Array [32];
  float local_438 [6];
  long alStack_420 [127];
  
  alStack_420[0x7e] = *(long *)(in_FS_OFFSET + 0x28);
  if (Segments < 1) {
    uVar4 = 0;
  }
  else {
    fVar9 = (float)Segments;
    uVar4 = 0;
    iVar3 = 0;
    do {
      fVar7 = ((float)iVar3 / fVar9 + (float)iVar3 / fVar9) * 3.1415927;
      fVar10 = (float)(iVar3 + 1) / fVar9;
      iVar3 = iVar3 + 2;
      fVar11 = (fVar10 + fVar10) * 3.1415927;
      fVar8 = ((float)iVar3 / fVar9 + (float)iVar3 / fVar9) * 3.1415927;
      fVar10 = cosf(fVar7);
      fVar5 = cosf(fVar11);
      fVar6 = cosf(fVar8);
      fVar7 = sinf(fVar7);
      fVar11 = sinf(fVar11);
      fVar8 = sinf(fVar8);
      lVar2 = (long)(int)uVar4;
      uVar4 = uVar4 + 1;
      local_438[lVar2 * 8] = x;
      local_438[lVar2 * 8 + 1] = y;
      local_438[lVar2 * 8 + 2] = fVar10 * r + x;
      local_438[lVar2 * 8 + 3] = fVar7 * r + y;
      *(float *)(alStack_420 + lVar2 * 4 + -1) = fVar6 * r + x;
      *(float *)((long)alStack_420 + lVar2 * 0x20 + -4) = fVar8 * r + y;
      alStack_420[lVar2 * 4] = CONCAT44(fVar11 * r + y,fVar5 * r + x);
      if (uVar4 == 0x20) {
        pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        (*(pIVar1->super_IInterface)._vptr_IInterface[0x1e])(pIVar1,local_438,0x20);
        uVar4 = 0;
      }
    } while (iVar3 < Segments);
  }
  if (uVar4 != 0) {
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x1e])(pIVar1,local_438,(ulong)uVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != alStack_420[0x7e]) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEmoticon::DrawCircle(float x, float y, float r, int Segments)
{
	IGraphics::CFreeformItem Array[32];
	int NumItems = 0;
	float FSegments = (float)Segments;
	for(int i = 0; i < Segments; i+=2)
	{
		float a1 = i/FSegments * 2*pi;
		float a2 = (i+1)/FSegments * 2*pi;
		float a3 = (i+2)/FSegments * 2*pi;
		float Ca1 = cosf(a1);
		float Ca2 = cosf(a2);
		float Ca3 = cosf(a3);
		float Sa1 = sinf(a1);
		float Sa2 = sinf(a2);
		float Sa3 = sinf(a3);

		Array[NumItems++] = IGraphics::CFreeformItem(
			x, y,
			x+Ca1*r, y+Sa1*r,
			x+Ca3*r, y+Sa3*r,
			x+Ca2*r, y+Sa2*r);
		if(NumItems == 32)
		{
			m_pClient->Graphics()->QuadsDrawFreeform(Array, 32);
			NumItems = 0;
		}
	}
	if(NumItems)
		m_pClient->Graphics()->QuadsDrawFreeform(Array, NumItems);
}